

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O0

int Ivy_FastMapArea(Ivy_Man_t *pAig)

{
  Vec_Vec_t *p;
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Supp_t *pIVar3;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Ivy_Obj_t *pObj;
  Vec_Vec_t *vLuts;
  Ivy_Man_t *pAig_local;
  
  local_28 = 0;
  p = *(Vec_Vec_t **)((long)pAig->pData + 0x18);
  Vec_VecClear(p);
  for (local_24 = 0; iVar1 = Vec_PtrSize(pAig->vPos), local_24 < iVar1; local_24 = local_24 + 1) {
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(pAig->vPos,local_24);
    pIVar2 = Ivy_ObjFanin0(pIVar2);
    iVar1 = Ivy_FastMapArea_rec(pAig,pIVar2,p);
    local_28 = iVar1 + local_28;
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_24);
    if ((pIVar2 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsNode(pIVar2), iVar1 != 0)) {
      pIVar3 = Ivy_ObjSupp(pAig,pIVar2);
      pIVar3->fMark = '\0';
    }
  }
  return local_28;
}

Assistant:

int Ivy_FastMapArea( Ivy_Man_t * pAig )
{
    Vec_Vec_t * vLuts;
    Ivy_Obj_t * pObj;
    int i, Counter = 0;
    // get the array to store the nodes
    vLuts = ((Ivy_SuppMan_t *)pAig->pData)->vLuts;
    Vec_VecClear( vLuts );
    // explore starting from each node
    Ivy_ManForEachPo( pAig, pObj, i )
        Counter += Ivy_FastMapArea_rec( pAig, Ivy_ObjFanin0(pObj), vLuts );
    // clean the marks
    Ivy_ManForEachNode( pAig, pObj, i )
        Ivy_ObjSupp( pAig, pObj )->fMark = 0;
    return Counter;
}